

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void var_object_test(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int op,DynBuf *bc,
                    int *plabel_done,BOOL is_with)

{
  JSAtomStruct *pJVar1;
  uint32_t val;
  uint8_t c;
  
  c = 'r';
  if (op != 0xb5) {
    c = (char)op + 0xbc;
  }
  dbuf_putc(bc,c);
  if (0xd1 < (int)var_name) {
    pJVar1 = ctx->rt->atom_array[var_name];
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
  }
  dbuf_put_u32(bc,var_name);
  val = new_label_fd(s,*plabel_done);
  *plabel_done = val;
  dbuf_put_u32(bc,val);
  dbuf_putc(bc,(uint8_t)is_with);
  s->label_slots[*plabel_done].ref_count = s->label_slots[*plabel_done].ref_count + 1;
  s->jump_size = s->jump_size + 1;
  return;
}

Assistant:

static void var_object_test(JSContext *ctx, JSFunctionDef *s,
                            JSAtom var_name, int op, DynBuf *bc,
                            int *plabel_done, BOOL is_with)
{
    dbuf_putc(bc, get_with_scope_opcode(op));
    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
    *plabel_done = new_label_fd(s, *plabel_done);
    dbuf_put_u32(bc, *plabel_done);
    dbuf_putc(bc, is_with);
    update_label(s, *plabel_done, 1);
    s->jump_size++;
}